

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

int ps_set_alignment(ps_decoder_t *ps,ps_alignment_t *al)

{
  bool bVar1;
  int iVar2;
  ps_search_t *search_00;
  ps_seg_t *local_38;
  ps_seg_t *seg;
  int new_alignment;
  ps_search_t *search;
  ps_alignment_t *al_local;
  ps_decoder_t *ps_local;
  
  bVar1 = false;
  if (al == (ps_alignment_t *)0x0) {
    local_38 = ps_seg_iter(ps);
    if (local_38 == (ps_seg_t *)0x0) {
      return -1;
    }
    search = (ps_search_t *)ps_alignment_init(ps->d2p);
    bVar1 = true;
    for (; local_38 != (ps_seg_t *)0x0; local_38 = ps_seg_next(local_38)) {
      if (local_38->wid == -1) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                ,0x2ed,"No word ID for segment %s, cannot align\n",local_38->text);
        goto LAB_0010b341;
      }
      ps_alignment_add_word
                ((ps_alignment_t *)search,local_38->wid,local_38->sf,
                 (local_38->ef - local_38->sf) + 1);
    }
    iVar2 = ps_alignment_populate((ps_alignment_t *)search);
    if (iVar2 < 0) goto LAB_0010b341;
  }
  else {
    search = (ps_search_t *)ps_alignment_retain(al);
  }
  search_00 = state_align_search_init("_state_align",ps->config,ps->acmod,(ps_alignment_t *)search);
  if (search_00 != (ps_search_t *)0x0) {
    if (bVar1) {
      ps_alignment_free((ps_alignment_t *)search);
    }
    iVar2 = set_search_internal(ps,search_00);
    if (-1 < iVar2) {
      iVar2 = ps_activate_search(ps,"_state_align");
      return iVar2;
    }
  }
LAB_0010b341:
  if (bVar1) {
    ps_alignment_free((ps_alignment_t *)search);
  }
  return -1;
}

Assistant:

int
ps_set_alignment(ps_decoder_t *ps, ps_alignment_t *al)
{
    ps_search_t *search;
    int new_alignment = FALSE;
    
    if (al == NULL) {
        ps_seg_t *seg;
        seg = ps_seg_iter(ps);
        if (seg == NULL)
            return -1;
        al = ps_alignment_init(ps->d2p);
        new_alignment = TRUE;
        while (seg) {
            if (seg->wid == BAD_S3WID) {
                E_ERROR("No word ID for segment %s, cannot align\n",
                        seg->text);
                goto error_out;
            }
            ps_alignment_add_word(al, seg->wid, seg->sf, seg->ef - seg->sf + 1);
            seg = ps_seg_next(seg);
        }
        /* FIXME: Add cionly parameter as in SoundSwallower */
        if (ps_alignment_populate(al) < 0)
            goto error_out;
    }
    else
        al = ps_alignment_retain(al);
    search = state_align_search_init("_state_align", ps->config, ps->acmod, al);
    if (search == NULL)
        goto error_out;
    if (new_alignment)
        ps_alignment_free(al);
    if (set_search_internal(ps, search) < 0)
        goto error_out;
    return ps_activate_search(ps, "_state_align");
error_out:
    if (new_alignment)
        ps_alignment_free(al);
    return -1;
}